

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O0

string * __thiscall
spirv_cross::CompilerMSL::get_tess_factor_struct_name_abi_cxx11_
          (string *__return_storage_ptr__,CompilerMSL *this)

{
  bool bVar1;
  allocator local_2d [20];
  allocator local_19;
  CompilerMSL *local_18;
  CompilerMSL *this_local;
  
  local_18 = this;
  this_local = (CompilerMSL *)__return_storage_ptr__;
  bVar1 = Compiler::is_tessellating_triangles((Compiler *)this);
  if (bVar1) {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"MTLTriangleTessellationFactorsHalf",&local_19);
    ::std::allocator<char>::~allocator((allocator<char> *)&local_19);
  }
  else {
    ::std::allocator<char>::allocator();
    ::std::__cxx11::string::string
              ((string *)__return_storage_ptr__,"MTLQuadTessellationFactorsHalf",local_2d);
    ::std::allocator<char>::~allocator((allocator<char> *)local_2d);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string CompilerMSL::get_tess_factor_struct_name()
{
	if (is_tessellating_triangles())
		return "MTLTriangleTessellationFactorsHalf";
	return "MTLQuadTessellationFactorsHalf";
}